

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O1

xmlHashEntry *
xmlHashFindEntry(xmlHashTable *hash,xmlChar *key,xmlChar *key2,xmlChar *key3,uint hashValue,
                int *pfound)

{
  xmlHashEntry *pxVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  xmlHashEntry *pxVar5;
  uint uVar6;
  bool bVar7;
  
  uVar6 = hash->size - 1;
  uVar3 = uVar6 & hashValue;
  pxVar1 = hash->table;
  pxVar5 = pxVar1 + uVar3;
  if (pxVar5->hashValue == 0) {
    iVar2 = 0;
LAB_00130ae3:
    *pfound = iVar2;
    return pxVar5;
  }
  uVar4 = 0;
  do {
    uVar3 = uVar3 + 1;
    if (pxVar5->hashValue == (hashValue | 0x80000000)) {
      if ((((hash->dict != (xmlDictPtr)0x0) && (pxVar5->key == key)) && (pxVar5->key2 == key2)) &&
         (pxVar5->key3 == key3)) {
LAB_00130ada:
        iVar2 = 1;
        goto LAB_00130ae3;
      }
      iVar2 = strcmp((char *)pxVar5->key,(char *)key);
      if (iVar2 == 0) {
        bVar7 = key2 == (xmlChar *)0x0;
        if (pxVar5->key2 != (xmlChar *)0x0) {
          if (key2 == (xmlChar *)0x0) goto LAB_00130a61;
          iVar2 = strcmp((char *)pxVar5->key2,(char *)key2);
          bVar7 = iVar2 == 0;
        }
        if (bVar7) {
          bVar7 = key3 == (xmlChar *)0x0;
          if (pxVar5->key3 != (xmlChar *)0x0) {
            if (key3 == (xmlChar *)0x0) goto LAB_00130a61;
            iVar2 = strcmp((char *)pxVar5->key3,(char *)key3);
            bVar7 = iVar2 == 0;
          }
          if (bVar7) goto LAB_00130ada;
        }
      }
    }
LAB_00130a61:
    pxVar5 = pxVar5 + 1;
    if ((uVar3 & uVar6) == 0) {
      pxVar5 = pxVar1;
    }
    iVar2 = 0;
    if ((pxVar5->hashValue == 0) || (uVar4 = uVar4 + 1, (uVar3 - pxVar5->hashValue & uVar6) < uVar4)
       ) goto LAB_00130ae3;
  } while( true );
}

Assistant:

ATTRIBUTE_NO_SANITIZE_INTEGER
static xmlHashEntry *
xmlHashFindEntry(const xmlHashTable *hash, const xmlChar *key,
                 const xmlChar *key2, const xmlChar *key3,
                 unsigned hashValue, int *pfound) {
    xmlHashEntry *entry;
    unsigned mask, pos, displ;
    int found = 0;

    mask = hash->size - 1;
    pos = hashValue & mask;
    entry = &hash->table[pos];

    if (entry->hashValue != 0) {
        /*
         * Robin hood hashing: abort if the displacement of the entry
         * is smaller than the displacement of the key we look for.
         * This also stops at the correct position when inserting.
         */
        displ = 0;
        hashValue |= MAX_HASH_SIZE;

        do {
            if (entry->hashValue == hashValue) {
                if (hash->dict) {
                    if ((entry->key == key) &&
                        (entry->key2 == key2) &&
                        (entry->key3 == key3)) {
                        found = 1;
                        break;
                    }
                }
                if ((strcmp((const char *) entry->key,
                            (const char *) key) == 0) &&
                    (xmlFastStrEqual(entry->key2, key2)) &&
                    (xmlFastStrEqual(entry->key3, key3))) {
                    found = 1;
                    break;
                }
            }

            displ++;
            pos++;
            entry++;
            if ((pos & mask) == 0)
                entry = hash->table;
        } while ((entry->hashValue != 0) &&
                 (((pos - entry->hashValue) & mask) >= displ));
    }

    *pfound = found;
    return(entry);
}